

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

void __thiscall
testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MinMaxTest>::AddTestPattern
          (ParameterizedTestSuiteInfo<(anonymous_namespace)::MinMaxTest> *this,char *test_suite_name
          ,char *test_base_name,
          TestMetaFactoryBase<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_int_*,_int_*)>
          *meta_factory,CodeLocation *code_location)

{
  pointer pcVar1;
  pointer psVar2;
  ParameterizedTestSuiteInfo<(anonymous_namespace)::MinMaxTest> *pPVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  ulong uVar6;
  pointer psVar7;
  pointer psVar8;
  pointer psVar9;
  pointer psVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  ulong uVar11;
  ulong uVar12;
  allocator local_69;
  pointer local_68;
  ParameterizedTestSuiteInfo<(anonymous_namespace)::MinMaxTest> *local_60;
  undefined1 *local_58;
  long local_50;
  undefined1 local_48 [16];
  int local_38;
  
  peVar4 = (element_type *)operator_new(0x70);
  local_58 = local_48;
  pcVar1 = (code_location->file)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + (code_location->file)._M_string_length);
  local_38 = code_location->line;
  std::__cxx11::string::string((string *)peVar4,test_suite_name,&local_69);
  std::__cxx11::string::string((string *)&peVar4->test_base_name,test_base_name,&local_69);
  (peVar4->test_meta_factory)._M_t.
  super___uniq_ptr_impl<testing::internal::TestMetaFactoryBase<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_int_*,_int_*)>,_std::default_delete<testing::internal::TestMetaFactoryBase<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_int_*,_int_*)>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_int_*,_int_*)>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_int_*,_int_*)>_>_>
       = (_Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_int_*,_int_*)>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_int_*,_int_*)>_>_>
          )meta_factory;
  (peVar4->code_location).file._M_dataplus._M_p = (pointer)&(peVar4->code_location).file.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&peVar4->code_location,local_58,local_58 + local_50);
  (peVar4->code_location).line = local_38;
  p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  p_Var5->_M_use_count = 1;
  p_Var5->_M_weak_count = 1;
  p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_010ad1c8;
  p_Var5[1]._vptr__Sp_counted_base = (_func_int **)peVar4;
  psVar2 = (this->tests_).
           super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MinMaxTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MinMaxTest>::TestInfo>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar2 == (this->tests_).
                super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MinMaxTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MinMaxTest>::TestInfo>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    psVar10 = (this->tests_).
              super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MinMaxTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MinMaxTest>::TestInfo>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_60 = this;
    if ((long)psVar2 - (long)psVar10 == 0x7ffffffffffffff0) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar11 = (long)psVar2 - (long)psVar10 >> 4;
    uVar6 = 1;
    if (psVar2 != psVar10) {
      uVar6 = uVar11;
    }
    uVar12 = uVar6 + uVar11;
    if (0x7fffffffffffffe < uVar12) {
      uVar12 = 0x7ffffffffffffff;
    }
    if (CARRY8(uVar6,uVar11)) {
      uVar12 = 0x7ffffffffffffff;
    }
    if (uVar12 == 0) {
      psVar7 = (pointer)0x0;
    }
    else {
      local_68 = psVar10;
      psVar7 = (pointer)operator_new(uVar12 << 4);
      psVar10 = local_68;
    }
    pPVar3 = local_60;
    psVar7[uVar11].
    super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MinMaxTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = peVar4;
    psVar7[uVar11].
    super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MinMaxTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = p_Var5;
    psVar9 = psVar7;
    for (psVar8 = psVar10; psVar2 != psVar8; psVar8 = psVar8 + 1) {
      (psVar9->
      super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MinMaxTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
      )._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      peVar4 = (psVar8->
               super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MinMaxTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr;
      p_Var5 = (psVar8->
               super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MinMaxTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
               )._M_refcount._M_pi;
      (psVar8->
      super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MinMaxTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
      )._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (psVar9->
      super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MinMaxTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
      )._M_ptr = peVar4;
      (psVar9->
      super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MinMaxTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
      )._M_refcount._M_pi = p_Var5;
      (psVar8->
      super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MinMaxTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
      )._M_ptr = (element_type *)0x0;
      psVar9 = psVar9 + 1;
    }
    if (psVar10 != (pointer)0x0) {
      operator_delete(psVar10);
    }
    (pPVar3->tests_).
    super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MinMaxTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MinMaxTest>::TestInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_start = psVar7;
    (pPVar3->tests_).
    super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MinMaxTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MinMaxTest>::TestInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = psVar9 + 1;
    (pPVar3->tests_).
    super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MinMaxTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MinMaxTest>::TestInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = psVar7 + uVar12;
  }
  else {
    (psVar2->
    super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MinMaxTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
    )._M_ptr = peVar4;
    (psVar2->
    super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MinMaxTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
    )._M_refcount._M_pi = p_Var5;
    (this->tests_).
    super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MinMaxTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MinMaxTest>::TestInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = psVar2 + 1;
  }
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  return;
}

Assistant:

void AddTestPattern(const char* test_suite_name, const char* test_base_name,
                      TestMetaFactoryBase<ParamType>* meta_factory,
                      CodeLocation code_location) {
    tests_.push_back(std::shared_ptr<TestInfo>(new TestInfo(
        test_suite_name, test_base_name, meta_factory, code_location)));
  }